

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPMRenderer.cpp
# Opt level: O0

Color * __thiscall
PPMRenderer::calcRefr
          (PPMRenderer *this,Collision *collision,Ray *ray,int depth,Color *weight,bool inside,
          int *hashId,vector<RtHitPoint,_std::allocator<RtHitPoint>_> *hitPoints,Mat *img)

{
  bool bVar1;
  long in_RDX;
  Vector3 *in_RSI;
  Vector3 *in_RDI;
  double __x;
  byte in_stack_00000008;
  bool in_stack_0000000f;
  Color *in_stack_00000010;
  undefined4 in_stack_00000018;
  int in_stack_0000001c;
  Ray *in_stack_00000020;
  PPMRenderer *in_stack_00000028;
  int *in_stack_00000040;
  vector<RtHitPoint,_std::allocator<RtHitPoint>_> *in_stack_00000048;
  Mat *in_stack_00000050;
  Vector3 new_weight;
  Ray newRay;
  bool new_inside;
  double n;
  Primitive *primitive;
  type_info *in_stack_fffffffffffffdf8;
  Vector3 *in_stack_fffffffffffffe00;
  Ray *this_00;
  Vector3 *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  bool *in_stack_fffffffffffffe38;
  bool *pbVar2;
  Vector3 *N;
  Ray *in_stack_fffffffffffffe58;
  Vector3 local_148;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  Vector3 local_f0;
  Vector3 local_d8;
  Vector3 local_c0;
  Vector3 local_a8;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  byte local_49;
  double local_48;
  bool *local_40;
  byte local_31;
  long local_18;
  
  local_31 = in_stack_00000008 & 1;
  pbVar2 = *(bool **)(in_RDX + 0x58);
  local_48 = *(double *)(pbVar2 + 0x60);
  N = in_RDI;
  local_40 = pbVar2;
  local_18 = in_RDX;
  if (local_31 != 0) {
    in_stack_fffffffffffffe38 = pbVar2;
    if (pbVar2 == (bool *)0x0) {
      __cxa_bad_typeid();
      in_stack_fffffffffffffe38 = pbVar2;
    }
    bVar1 = std::type_info::operator!=
                      ((type_info *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    if (bVar1) {
      local_48 = 1.0 / local_48;
    }
  }
  Ray::refracted(in_stack_fffffffffffffe58,in_RSI,N,(double)in_RDI,in_stack_fffffffffffffe38);
  if (local_40 == (bool *)0x0) {
    __cxa_bad_typeid();
  }
  bVar1 = std::type_info::operator==
                    ((type_info *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                     (type_info *)in_stack_fffffffffffffe08);
  if (bVar1) {
    local_49 = 0;
  }
  local_49 = (local_49 ^ local_31) & 1;
  ::operator*(in_stack_fffffffffffffe08,&in_stack_fffffffffffffe00->x);
  if ((local_31 & 1) != 0) {
    if (local_40 == (bool *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator!=
                      ((type_info *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    if (bVar1) {
      Vector3::Vector3(&local_f0,-*(double *)(local_18 + 0x50));
      ::operator*(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      exp(__x);
      operator*=((Vector3 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08);
      Vector3::~Vector3(&local_c0);
      Vector3::~Vector3(&local_d8);
      Vector3::~Vector3(&local_f0);
    }
  }
  local_108 = local_60;
  uStack_100 = uStack_58;
  local_118 = local_70;
  uStack_110 = uStack_68;
  local_128 = local_80;
  uStack_120 = uStack_78;
  local_148.z = local_a8.z;
  local_148.x = local_a8.x;
  local_148.y = local_a8.y;
  this_00 = (Ray *)CONCAT44(in_stack_0000001c,in_stack_00000018);
  cv::Mat::Mat((Mat *)&stack0xfffffffffffffe58,(Mat *)in_stack_00000020);
  rayTrace(in_stack_00000028,in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_0000000f
           ,in_stack_00000040,in_stack_00000048,in_stack_00000050);
  cv::Mat::~Mat((Mat *)&stack0xfffffffffffffe58);
  Vector3::~Vector3(&local_148);
  Ray::~Ray(this_00);
  Vector3::~Vector3(&local_a8);
  Ray::~Ray(this_00);
  return N;
}

Assistant:

Color
PPMRenderer::calcRefr(const Collision &collision, const Ray &ray, int depth, const Color &weight, bool inside,
                      int &hashId, std::vector<RtHitPoint> &hitPoints, Mat &img)
{
    Primitive *primitive = collision.primitive;
    double n = primitive->rindex;
    if (inside && typeid(*primitive) != typeid(Bezier)) n = 1 / n;
    bool new_inside;
    Ray newRay = ray.refracted(collision.P, collision.N, n, new_inside);
    if (typeid(*primitive) == typeid(Bezier)) new_inside = 0;
    new_inside ^= inside;
    Vector3 new_weight = weight * primitive->refr;
    if (inside && typeid(*primitive) != typeid(Bezier))
        new_weight *= exp(-collision.dist * primitive->absor);
    return rayTrace(newRay, depth - 1, new_weight, new_inside, hashId, hitPoints, img);
}